

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O3

void do_bench(void)

{
  StatMatrix_t ppsVar1;
  fdb_status fVar2;
  StatAggregator *this;
  long *plVar3;
  ulong uVar4;
  UI *pUVar5;
  long lVar6;
  UI_STRING *pUVar7;
  char *__format;
  stat_history_t *psVar8;
  int iVar9;
  fdb_kvs_handle **ppfVar10;
  fdb_kvs_handle **ptr_handle;
  bool bVar11;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char cmd [64];
  char dbname [64];
  char fname [64];
  fdb_config fconfig;
  fdb_kvs_config local_3aa0;
  timeval local_3a88;
  fdb_file_handle *local_3a78 [16];
  char local_39f8 [64];
  char local_39b8 [64];
  char local_3978 [72];
  fdb_config local_3930;
  fdb_kvs_handle *local_3838 [256];
  fdb_kvs_handle *local_3038 [256];
  fdb_kvs_handle *local_2838 [4];
  long local_2818 [1277];
  
  gettimeofday(&local_3a88,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  this = (StatAggregator *)operator_new(0x10);
  StatAggregator::StatAggregator(this,4,0x100);
  psVar8 = *this->t_stats;
  plVar3 = local_2818;
  lVar6 = 0;
  do {
    std::__cxx11::string::_M_replace
              ((long)&(psVar8->name)._M_dataplus._M_p + lVar6,0,
               *(char **)((long)&(psVar8->name)._M_string_length + lVar6),0x13f1ff);
    std::__cxx11::string::_M_replace
              ((long)&(this->t_stats[1]->name)._M_dataplus._M_p + lVar6,0,
               *(char **)((long)&(this->t_stats[1]->name)._M_string_length + lVar6),0x13f20d);
    std::__cxx11::string::_M_replace
              ((long)&(this->t_stats[2]->name)._M_dataplus._M_p + lVar6,0,
               *(char **)((long)&(this->t_stats[2]->name)._M_string_length + lVar6),0x13f21b);
    std::__cxx11::string::_M_replace
              ((long)&(this->t_stats[3]->name)._M_dataplus._M_p + lVar6,0,
               *(char **)((long)&(this->t_stats[3]->name)._M_string_length + lVar6),0x13f228);
    ppsVar1 = this->t_stats;
    psVar8 = *ppsVar1;
    plVar3[-3] = (long)&(psVar8->name)._M_dataplus._M_p + lVar6;
    plVar3[-1] = (long)&(ppsVar1[1]->name)._M_dataplus._M_p + lVar6;
    plVar3[-2] = (long)&(ppsVar1[2]->name)._M_dataplus._M_p + lVar6;
    *plVar3 = (long)&(ppsVar1[3]->name)._M_dataplus._M_p + lVar6;
    lVar6 = lVar6 + 0x38;
    plVar3 = plVar3 + 5;
  } while (lVar6 != 0x3800);
  builtin_strncpy(local_39f8 + 0x10,"rlog.txt",9);
  builtin_strncpy(local_39f8,"rm bench* > erro",0x10);
  system(local_39f8);
  local_3930.compaction_mode = '\0';
  local_3930.auto_commit = false;
  local_3930.compactor_sleep_duration = 600;
  local_3930.prefetch_duration = 0;
  local_3930.num_compactor_threads = 1;
  local_3930.num_bgflusher_threads = 0;
  ppfVar10 = local_3838;
  uVar4 = 0;
  iVar9 = 0;
  do {
    sprintf(local_3978,"bench%d",uVar4 & 0xffffffff);
    fVar2 = fdb_open(local_3a78 + uVar4,local_3978,&local_3930);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                    ,0x103,"void do_bench()");
    }
    lVar6 = 0;
    ptr_handle = ppfVar10;
    do {
      sprintf(local_39b8,"db%d",(ulong)(uint)(iVar9 + (int)lVar6));
      fVar2 = fdb_kvs_open(local_3a78[uVar4],ptr_handle,local_39b8,&local_3aa0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x109,"void do_bench()");
      }
      lVar6 = lVar6 + 1;
      ptr_handle = ptr_handle + 1;
    } while (lVar6 != 0x10);
    uVar4 = uVar4 + 1;
    iVar9 = iVar9 + 0x10;
    ppfVar10 = ppfVar10 + 0x10;
  } while (uVar4 != 0x10);
  lVar6 = 0;
  do {
    fVar2 = fdb_commit(local_3a78[lVar6],'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                    ,0x111,"void do_bench()");
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  iVar9 = 0;
  while( true ) {
    pUVar7 = (UI_STRING *)0x0;
    writer((UI *)local_3838[0],(UI_STRING *)0x0);
    local_2838[0] = local_3838[0];
    reader((UI *)local_2838,pUVar7);
    pUVar7 = (UI_STRING *)local_3038;
    fVar2 = fdb_snapshot_open(local_3838[0],local_3038,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    local_2838[0] = local_3038[0];
    reader((UI *)local_2838,pUVar7);
    uVar4 = 0;
    do {
      writer((UI *)local_3838[uVar4],(UI_STRING *)(uVar4 & 0xffffffff));
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x10);
    uVar4 = 0;
    do {
      pUVar7 = (UI_STRING *)(uVar4 & 0xffffffff);
      deletes(local_3838[uVar4],(int)uVar4);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x10);
    lVar6 = 0;
    pUVar5 = (UI *)local_2838;
    do {
      *(fdb_kvs_handle **)pUVar5 = local_3838[lVar6];
      reader(pUVar5,pUVar7);
      lVar6 = lVar6 + 1;
      pUVar5 = pUVar5 + 0x28;
    } while (lVar6 != 0x10);
    lVar6 = 0;
    pUVar5 = (UI *)local_2838;
    do {
      pUVar7 = (UI_STRING *)((long)local_3038 + lVar6);
      fVar2 = fdb_snapshot_open(*(fdb_kvs_handle **)((long)local_3838 + lVar6),
                                (fdb_kvs_handle **)pUVar7,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        do_bench();
        goto LAB_00105a6e;
      }
      *(undefined8 *)pUVar5 = *(undefined8 *)((long)local_3038 + lVar6);
      reader(pUVar5,pUVar7);
      pUVar5 = pUVar5 + 0x28;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x80);
    fVar2 = fdb_commit(local_3a78[0],'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00105b0e;
    uVar4 = 0;
    do {
      writer((UI *)local_3838[uVar4],(UI_STRING *)(uVar4 & 0xffffffff));
      bVar11 = uVar4 < 0xf0;
      uVar4 = uVar4 + 0x10;
    } while (bVar11);
    uVar4 = 0;
    do {
      pUVar7 = (UI_STRING *)(uVar4 & 0xffffffff);
      deletes(local_3838[uVar4],(int)uVar4);
      bVar11 = uVar4 < 0xf0;
      uVar4 = uVar4 + 0x10;
    } while (bVar11);
    uVar4 = 0xfffffffffffffff0;
    pUVar5 = (UI *)local_2838;
    do {
      *(fdb_kvs_handle **)pUVar5 = local_3038[uVar4 - 0xf0];
      reader(pUVar5,pUVar7);
      uVar4 = uVar4 + 0x10;
      pUVar5 = pUVar5 + 0x280;
    } while (uVar4 < 0xf0);
    uVar4 = 0;
    do {
      pUVar7 = (UI_STRING *)(local_3038 + uVar4);
      fVar2 = fdb_snapshot_open(local_3838[uVar4],(fdb_kvs_handle **)pUVar7,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00105a6e:
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x14a,"void do_bench()");
      }
      local_2838[uVar4 * 5] = local_3038[uVar4];
      reader((UI *)(local_2838 + uVar4 * 5),pUVar7);
      bVar11 = uVar4 < 0xf0;
      uVar4 = uVar4 + 0x10;
    } while (bVar11);
    uVar4 = 0;
    do {
      writer((UI *)local_3838[uVar4],(UI_STRING *)(uVar4 & 0xffffffff));
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x100);
    uVar4 = 0;
    do {
      pUVar7 = (UI_STRING *)(uVar4 & 0xffffffff);
      deletes(local_3838[uVar4],(int)uVar4);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x100);
    lVar6 = 0;
    pUVar5 = (UI *)local_2838;
    do {
      *(fdb_kvs_handle **)pUVar5 = local_3838[lVar6];
      reader(pUVar5,pUVar7);
      lVar6 = lVar6 + 1;
      pUVar5 = pUVar5 + 0x28;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    pUVar5 = (UI *)local_2838;
    do {
      pUVar7 = (UI_STRING *)((long)local_3038 + lVar6);
      fVar2 = fdb_snapshot_open(*(fdb_kvs_handle **)((long)local_3838 + lVar6),
                                (fdb_kvs_handle **)pUVar7,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x15d,"void do_bench()");
      }
      *(undefined8 *)pUVar5 = *(undefined8 *)((long)local_3038 + lVar6);
      reader(pUVar5,pUVar7);
      pUVar5 = pUVar5 + 0x28;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x800);
    lVar6 = 0;
    do {
      fVar2 = fdb_commit(local_3a78[lVar6],'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x165,"void do_bench()");
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    iVar9 = iVar9 + 1;
    if (iVar9 == 5) {
      lVar6 = 0;
      do {
        fVar2 = fdb_compact(local_3a78[lVar6],(char *)0x0);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                        ,0x16b,"void do_bench()");
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      StatAggregator::aggregateAndPrintStats(this,"ITERATOR_TEST_STATS",0x100,anon_var_dwarf_615);
      StatAggregator::~StatAggregator(this);
      operator_delete(this);
      print_db_stats(local_3a78,0x10);
      lVar6 = 0;
      do {
        fdb_kvs_close(local_3838[lVar6]);
        fdb_kvs_close(local_3038[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      lVar6 = 0;
      do {
        fdb_close(local_3a78[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      fdb_shutdown();
      builtin_strncpy(local_39f8,"rm bench* > errorlog.txt",0x19);
      system(local_39f8);
      __format = "%s PASSED\n";
      if (do_bench()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"Benchmark done");
      return;
    }
  }
  do_bench();
LAB_00105b0e:
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                ,0x13a,"void do_bench()");
}

Assistant:

void do_bench() {

    TEST_INIT();
    int i, j, r;
    int n_loops = 5;
    int n_kvs = 16;

    char cmd[64], fname[64], dbname[64];
    int n2_kvs = n_kvs * n_kvs;

    // file handlers
    fdb_status status;
    fdb_file_handle **dbfile = alca(fdb_file_handle*, n_kvs);
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, n2_kvs);
    fdb_kvs_handle **snap_db = alca(fdb_kvs_handle*, n2_kvs);
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();

    // reader stats
    reader_context *ctx = alca(reader_context, n2_kvs);

    StatAggregator *sa = new StatAggregator(4, n2_kvs);

    for (i = 0; i < n2_kvs; ++i) {
        sa->t_stats[0][i].name.assign(ST_ITR_INIT);
        sa->t_stats[1][i].name.assign(ST_ITR_NEXT);
        sa->t_stats[2][i].name.assign(ST_ITR_GET);
        sa->t_stats[3][i].name.assign(ST_ITR_CLOSE);
        ctx[i].stat_itr_init = &sa->t_stats[0][i];
        ctx[i].stat_itr_next = &sa->t_stats[1][i];
        ctx[i].stat_itr_get = &sa->t_stats[2][i];
        ctx[i].stat_itr_close = &sa->t_stats[3][i];
    }

    sprintf(cmd, "rm bench* > errorlog.txt");
    r = system(cmd);
    (void)r;

    // setup
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.auto_commit = false;
    fconfig.compactor_sleep_duration = 600;
    fconfig.prefetch_duration = 0;
    fconfig.num_compactor_threads = 1;
    fconfig.num_bgflusher_threads = 0;

    // open 16 dbfiles each with 16 kvs
    for (i = 0; i < n_kvs; ++i){
        sprintf(fname, "bench%d",i);
        status = fdb_open(&dbfile[i], fname, &fconfig);
        assert(status == FDB_RESULT_SUCCESS);

        for (j = i*n_kvs; j < (i*n_kvs + n_kvs); ++j){
            sprintf(dbname, "db%d",j);
            status = fdb_kvs_open(dbfile[i], &db[j],
                                  dbname, &kvs_config);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = 0; i < 10; ++i){
        // generate initial commit headers
        for (i = 0; i < n_kvs; i++){
            status = fdb_commit(dbfile[i], FDB_COMMIT_MANUAL_WAL_FLUSH);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }

    for (j = 0; j < n_loops; j++){

        // write to single file 1 kvs
        writer(db[0], 0);

        // reads from single file 1 kvs
        ctx[0].handle = db[0];
        reader(&ctx[0]);

        // snap iterator read
        status = fdb_snapshot_open(db[0], &snap_db[0],
                                   FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx[0].handle = snap_db[0];
        reader(&ctx[0]);

       // write/read/snap to single file 16 kvs
        for (i = 0;i < n_kvs; ++i){
            writer(db[i], i);
        }
        for (i = 0; i < n_kvs; ++i){
            deletes(db[i], i);
        }
        for (i = 0; i < n_kvs; ++i){
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n_kvs; ++i){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // commit single file
        status = fdb_commit(dbfile[0], FDB_COMMIT_MANUAL_WAL_FLUSH);
        assert(status == FDB_RESULT_SUCCESS);

        // write/write/snap to 16 files 1 kvs
        for (i = 0; i < n2_kvs; i += n_kvs){ // every 16 kvs is new file
            writer(db[i], i);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){
            deletes(db[i], i);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){ // every 16 kvs is new file
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            assert(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // write to 16 files 16 kvs each
        for (i = 0; i < n2_kvs; i++){
            writer(db[i], i);
        }
        for (i = 0; i < n2_kvs; ++i){
            deletes(db[i], i);
        }
        for (i = 0; i < n2_kvs; i++){
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n2_kvs; i++){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            assert(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // commit all
        for (i = 0;i < n_kvs; i++){
            status = fdb_commit(dbfile[i], FDB_COMMIT_MANUAL_WAL_FLUSH);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }
    // compact all
    for (i = 0; i < n_kvs; i++){
        status = fdb_compact(dbfile[i], NULL);
        assert(status == FDB_RESULT_SUCCESS);
    }

    // print aggregated reader stats
    sa->aggregateAndPrintStats("ITERATOR_TEST_STATS", n_kvs * n_kvs, "µs");
    delete sa;

    // print aggregated dbfile stats
    print_db_stats(dbfile, n_kvs);

    // cleanup
    for(i = 0; i < n2_kvs; i++){
        fdb_kvs_close(db[i]);
        fdb_kvs_close(snap_db[i]);
    }
    for(i = 0; i < n_kvs; i++){
        fdb_close(dbfile[i]);
    }

    fdb_shutdown();

    (void)status;
    sprintf(cmd, "rm bench* > errorlog.txt");
    r = system(cmd);
    (void)r;

    TEST_RESULT("Benchmark done");
}